

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O3

void __thiscall
tcu::Texture3D::Texture3D(Texture3D *this,TextureFormat *format,int width,int height,int depth)

{
  ConstPixelBufferAccess *pCVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = depth;
  if (depth < height) {
    uVar2 = height;
  }
  if ((int)uVar2 < width) {
    uVar2 = width;
  }
  uVar3 = 0x20;
  if (uVar2 != 0) {
    uVar3 = 0x1f;
    if (uVar2 != 0) {
      for (; uVar2 >> uVar3 == 0; uVar3 = uVar3 - 1) {
      }
    }
    uVar3 = uVar3 ^ 0x1f;
  }
  TextureLevelPyramid::TextureLevelPyramid(&this->super_TextureLevelPyramid,format,0x20 - uVar3);
  this->m_width = width;
  this->m_height = height;
  this->m_depth = depth;
  pCVar1 = &((this->super_TextureLevelPyramid).m_access.
             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
             _M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess;
  (this->m_view).m_numLevels =
       (int)((ulong)((long)(this->super_TextureLevelPyramid).m_access.
                           super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1) >> 3) *
       -0x33333333;
  (this->m_view).m_levels = pCVar1;
  return;
}

Assistant:

Texture3D::Texture3D (const TextureFormat& format, int width, int height, int depth)
	: TextureLevelPyramid	(format, computeMipPyramidLevels(width, height, depth))
	, m_width				(width)
	, m_height				(height)
	, m_depth				(depth)
	, m_view				(getNumLevels(), getLevels())
{
}